

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_common.h
# Opt level: O3

int __thiscall ktx::OptionsEncodeCommon::init(OptionsEncodeCommon *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  OptionAdder *pOVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  allocator<char> local_1ec;
  allocator<char> local_1eb;
  allocator<char> local_1ea;
  undefined1 local_1e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  shared_ptr<const_cxxopts::Value> local_148;
  string local_138;
  shared_ptr<const_cxxopts::Value> local_118;
  string local_108;
  shared_ptr<const_cxxopts::Value> local_e8;
  string local_d0;
  string local_b0;
  OptionAdder local_90;
  string local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_1e8 = &local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Encode common","");
  local_90.m_group._M_string_length = local_1e0;
  if (local_1e8 == &local_1d8) {
    local_168.field_2._8_8_ = local_1d8._8_8_;
    local_1e8 = &local_168.field_2;
  }
  local_168.field_2._M_allocated_capacity._1_7_ = local_1d8._M_allocated_capacity._1_7_;
  local_168.field_2._M_local_buf[0] = local_1d8._M_local_buf[0];
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  paVar1 = &local_90.m_group.field_2;
  local_90.m_group._M_dataplus._M_p = (pointer)local_1e8;
  if (local_1e8 == &local_168.field_2) {
    local_90.m_group.field_2._8_8_ = local_168.field_2._8_8_;
    local_90.m_group._M_dataplus._M_p = (pointer)paVar1;
  }
  local_90.m_group.field_2._M_allocated_capacity = local_168.field_2._M_allocated_capacity;
  local_1e8 = &local_1d8;
  local_90.m_options = (Options *)ctx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,kNormalMode,&local_1ea);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "Optimizes for encoding textures with normal data. If the input texture has three or four linear components it is assumed to be a three component linear normal map storing unit length normals as (R=X, G=Y, B=Z). A fourth component will be ignored. The map will be converted to a two component X+Y normal map stored as (RGB=X, A=Y) prior to encoding. If unsure that your normals are unit length, use --normalize. If the input has 2 linear components it is assumed to be an X+Y map of unit normals.\nThe Z component can be recovered programmatically in shader code by using the equations:\n    nml.xy = texture(...).ga;              // Load in [0,1]\n    nml.xy = nml.xy * 2.0 - 1.0;           // Unpack to [-1,1]\n    nml.z = sqrt(1 - dot(nml.xy, nml.xy)); // Compute Z\nETC1S / BasisLZ encoding, RDO is disabled (no selector RDO, no endpoint RDO) to provide better quality."
             ,"");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_108,(allocator<cxxopts::values::standard_value<bool>_> *)&local_b0);
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_108._M_dataplus._M_p._0_4_;
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_108._M_dataplus._M_p._4_4_;
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_108._M_string_length;
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_108._M_string_length._4_4_;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
  pOVar3 = cxxopts::OptionAdder::operator()(&local_90,&local_168,&local_188,&local_e8,&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,kThreads,&local_1eb);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "Sets the number of threads to use during encoding. By default, encoding will use the number of threads reported by thread::hardware_concurrency or 1 if value returned is 0."
             ,"");
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_138,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_d0);
  local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_138._M_dataplus._M_p._0_4_;
  local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_138._M_dataplus._M_p._4_4_;
  local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_138._M_string_length;
  local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_138._M_string_length._4_4_;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"<count>","");
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_108,&local_b0,&local_118,&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,kNoSse,&local_1ec);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "Forbid use of the SSE instruction set. Ignored if CPU does not support SSE. SSE can only be disabled on the basis-lz and uastc compressors."
             ,"");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_48,(allocator<cxxopts::values::standard_value<bool>_> *)&local_1e9);
  local_148.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_48;
  local_148.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       uStack_44;
  local_148.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = uStack_40;
  local_148.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = uStack_3c;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  cxxopts::OptionAdder::operator()(pOVar3,&local_138,&local_d0,&local_148,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_148.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_148.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_148.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_148.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_) !=
      &local_138.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_),
                    local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_118.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_118.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
      &local_108.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                    local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_e8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_e8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_168.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar4) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    paVar4 = extraout_RAX;
  }
  iVar2 = (int)paVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_group._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_group._M_dataplus._M_p,
                    local_90.m_group.field_2._M_allocated_capacity + 1);
    iVar2 = extraout_EAX;
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options("Encode common")
            (kNormalMode, "Optimizes for encoding textures with normal data. If the input texture has "
                "three or four linear components it is assumed to be a three component linear normal "
                "map storing unit length normals as (R=X, G=Y, B=Z). A fourth component will be ignored. "
                "The map will be converted to a two component X+Y normal map stored as (RGB=X, A=Y) "
                "prior to encoding. If unsure that your normals are unit length, use --normalize. "
                "If the input has 2 linear components it is assumed to be an X+Y map of unit normals.\n"
                "The Z component can be recovered programmatically in shader code by using the equations:\n"
                "    nml.xy = texture(...).ga;              // Load in [0,1]\n"
                "    nml.xy = nml.xy * 2.0 - 1.0;           // Unpack to [-1,1]\n"
                "    nml.z = sqrt(1 - dot(nml.xy, nml.xy)); // Compute Z\n"
                "ETC1S / BasisLZ encoding, RDO is disabled (no selector RDO, no endpoint RDO) to provide better quality.")
            (kThreads, "Sets the number of threads to use during encoding. By default, encoding "
                "will use the number of threads reported by thread::hardware_concurrency or 1 if "
                "value returned is 0.", cxxopts::value<uint32_t>(), "<count>")
            (kNoSse, "Forbid use of the SSE instruction set. Ignored if CPU does "
               "not support SSE. SSE can only be disabled on the basis-lz and "
               "uastc compressors.");
    }